

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_file_stream.cpp
# Opt level: O0

void basic_file_stream(void)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  void *this;
  long *plVar4;
  char local_449;
  char local_448 [7];
  char ch;
  ifstream fin;
  float local_23c;
  ostream local_238 [4];
  float num;
  ofstream fout;
  string local_28 [8];
  string filename;
  
  std::__cxx11::string::string(local_28);
  std::operator<<((ostream *)&std::cout,"Enter name of the new file:\n");
  std::operator>>((istream *)&std::cin,local_28);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nYour filename: ");
  poVar2 = std::operator<<(poVar2,local_28);
  poVar2 = std::operator<<(poVar2,"(");
  pcVar3 = (char *)std::__cxx11::string::c_str();
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,")\n");
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_238,pcVar3,_S_out);
  std::operator<<(local_238,"Something Bad Happened...\n");
  std::operator<<((ostream *)&std::cout,"Enter your secret num:\n");
  std::istream::operator>>(&std::cin,&local_23c);
  poVar2 = std::operator<<(local_238,"Your secret num is: ");
  this = (void *)std::ostream::operator<<(poVar2,local_23c);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_448,pcVar3,_S_in);
  poVar2 = std::operator<<((ostream *)&std::cout,"Content in file ");
  poVar2 = std::operator<<(poVar2,local_28);
  std::operator<<(poVar2,"\n");
  while( true ) {
    plVar4 = (long *)std::istream::get(local_448);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
    if (!bVar1) break;
    std::operator<<((ostream *)&std::cout,local_449);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::ifstream::close();
  std::ifstream::~ifstream(local_448);
  std::ofstream::~ofstream(local_238);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void basic_file_stream() {
    using namespace std;
    string filename;

    cout << "Enter name of the new file:\n";
    cin >> filename;

    //  c_str: c-style string, i.e. the char*
    cout << "\nYour filename: " << filename << "(" << filename.c_str() << ")\n";

    //  create file
    ofstream fout(filename.c_str());

    //  write to file
    fout << "Something Bad Happened...\n";

    float num;
    cout << "Enter your secret num:\n";
    cin >> num;
    fout << "Your secret num is: " << num << endl;
    fout.close();

    //  create another fstream
    ifstream fin(filename.c_str());
    cout << "Content in file " << filename << "\n";
    char ch;
    while(fin.get(ch)) {    //  read util EOF
        cout << ch; //  output to screen
    }

    cout << "\n";
    fin.close();
}